

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

string * cinatra::base64_encode(string *__return_storage_ptr__,string *str)

{
  undefined6 uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  ulong in_RAX;
  byte bVar5;
  int iVar6;
  int iVar7;
  size_type sVar8;
  pointer pcVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  char char_array_3 [3];
  char char_array_4 [4];
  undefined8 local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar8 = str->_M_string_length;
  local_38 = in_RAX;
  if (sVar8 == 0) {
    uVar10 = 0;
  }
  else {
    pcVar9 = (str->_M_dataplus)._M_p;
    uVar12 = 0;
    do {
      uVar2 = local_38;
      uVar11 = (int)uVar12 + 1;
      uVar10 = (ulong)uVar11;
      *(char *)((long)&local_38 + uVar12 + 1) = *pcVar9;
      if (uVar11 == 3) {
        bVar3 = local_38._1_1_;
        bVar4 = local_38._2_1_;
        bVar5 = local_38._1_1_ >> 2;
        local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
        local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
        uVar1 = (undefined6)local_38;
        local_38._3_1_ = SUB81(uVar2,3);
        bVar3 = local_38._3_1_;
        local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
        local_38 = CONCAT17(bVar3,(undefined7)local_38) & 0x3fffffffffffffff;
        lVar13 = 0;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    (__return_storage_ptr__,
                     *(char *)(base64_chars_abi_cxx11_ + *(char *)((long)&local_38 + lVar13 + 4)));
          lVar13 = lVar13 + 1;
        } while (lVar13 != 4);
        uVar10 = 0;
      }
      sVar8 = sVar8 - 1;
      pcVar9 = pcVar9 + 1;
      uVar12 = uVar10;
    } while (sVar8 != 0);
  }
  iVar7 = (int)uVar10;
  if (iVar7 != 0) {
    if (iVar7 < 3) {
      memset((void *)((long)&local_38 + uVar10 + 1),0,(ulong)(2 - iVar7) + 1);
    }
    uVar10 = local_38;
    bVar3 = local_38._1_1_;
    bVar4 = local_38._2_1_;
    bVar5 = local_38._1_1_ >> 2;
    local_38._0_5_ = CONCAT14(bVar5,(undefined4)local_38);
    local_38._0_6_ = CONCAT15((bVar3 & 3) << 4 | bVar4 >> 4,(undefined5)local_38);
    uVar1 = (undefined6)local_38;
    local_38._3_1_ = SUB81(uVar10,3);
    bVar3 = local_38._3_1_;
    local_38._0_7_ = CONCAT16((bVar4 & 0xf) << 2 | local_38._3_1_ >> 6,uVar1);
    local_38 = CONCAT17(bVar3,(undefined7)local_38) & 0x3fffffffffffffff;
    if (-1 < iVar7) {
      uVar10 = 0;
      do {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,
                   *(char *)(base64_chars_abi_cxx11_ + *(char *)((long)&local_38 + uVar10 + 4)));
        uVar10 = uVar10 + 1;
      } while (iVar7 + 1 != uVar10);
    }
    iVar6 = 3;
    if (3 < iVar7) {
      iVar6 = iVar7;
    }
    iVar7 = (iVar6 - iVar7) + 1;
    while (iVar7 = iVar7 + -1, iVar7 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'=');
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string base64_encode(const std::string &str) {
  std::string ret;
  int i = 0;
  int j = 0;
  char char_array_3[3];
  char char_array_4[4];

  auto bytes_to_encode = str.data();
  size_t in_len = str.size();
  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) ret += base64_chars[char_array_4[i]];
      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) char_array_3[j] = '\0';

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) ret += base64_chars[char_array_4[j]];

    while ((i++ < 3)) ret += '=';
  }

  return ret;
}